

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode DataValue_encodeBinary(UA_DataValue *src,UA_DataType *_)

{
  byte bVar1;
  UA_StatusCode UVar2;
  uint uVar3;
  UA_StatusCode UVar4;
  
  UVar4 = 0x80080000;
  if (pos + 1 <= end) {
    *pos = *(byte *)src & 0x3f;
    pos = pos + 1;
    UVar4 = 0;
  }
  bVar1 = *(byte *)src;
  if ((bVar1 & 1) != 0) {
    UVar2 = Variant_encodeBinary(&src->value,_);
    UVar4 = UVar4 | UVar2;
    bVar1 = *(byte *)src;
  }
  if ((bVar1 & 2) != 0) {
    UVar2 = StatusCode_encodeBinary(&src->status);
    UVar4 = UVar4 | UVar2;
    bVar1 = *(byte *)src;
  }
  if ((bVar1 & 4) != 0) {
    UVar2 = DateTime_encodeBinary(&src->sourceTimestamp);
    UVar4 = UVar4 | UVar2;
    bVar1 = *(byte *)src;
  }
  if ((bVar1 & 0x10) != 0) {
    uVar3 = 0x80080000;
    if (pos + 2 <= end) {
      *(UA_UInt16 *)pos = src->sourcePicoseconds;
      pos = pos + 2;
      bVar1 = *(byte *)src;
      uVar3 = 0;
    }
    UVar4 = UVar4 | uVar3;
  }
  if ((bVar1 & 8) != 0) {
    UVar2 = DateTime_encodeBinary(&src->serverTimestamp);
    UVar4 = UVar4 | UVar2;
    bVar1 = *(byte *)src;
  }
  if ((bVar1 & 0x20) != 0) {
    uVar3 = 0x80080000;
    if (pos + 2 <= end) {
      *(UA_UInt16 *)pos = src->serverPicoseconds;
      pos = pos + 2;
      uVar3 = 0;
    }
    UVar4 = UVar4 | uVar3;
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
DataValue_encodeBinary(UA_DataValue const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encodingMask = (UA_Byte)
        (src->hasValue | (src->hasStatus << 1) | (src->hasSourceTimestamp << 2) |
         (src->hasServerTimestamp << 3) | (src->hasSourcePicoseconds << 4) |
         (src->hasServerPicoseconds << 5));

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encodingMask, NULL);
    if(src->hasValue)
        retval |= Variant_encodeBinary(&src->value, NULL);
    if(src->hasStatus)
        retval |= StatusCode_encodeBinary(&src->status);
    if(src->hasSourceTimestamp)
        retval |= DateTime_encodeBinary(&src->sourceTimestamp);
    if(src->hasSourcePicoseconds)
        retval |= UInt16_encodeBinary(&src->sourcePicoseconds, NULL);
    if(src->hasServerTimestamp)
        retval |= DateTime_encodeBinary(&src->serverTimestamp);
    if(src->hasServerPicoseconds)
        retval |= UInt16_encodeBinary(&src->serverPicoseconds, NULL);
    return retval;
}